

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

void __thiscall
LLVMBC::NamedMDNode::NamedMDNode
          (NamedMDNode *this,Module *module,String *name_,Vector<MDNode_*> *operands_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_MDOperand).parent = module;
  (this->super_MDOperand).kind = NamedNode;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name_->_M_dataplus)._M_p;
  paVar2 = &name_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = name_->_M_string_length;
  (name_->_M_dataplus)._M_p = (pointer)paVar2;
  name_->_M_string_length = 0;
  (name_->field_2)._M_local_buf[0] = '\0';
  (this->operands).
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (operands_->
       super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->operands).
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (operands_->
       super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  (this->operands).
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (operands_->
       super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (operands_->
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (operands_->
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (operands_->
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

MDOperand::MDOperand(Module *parent_, MetadataKind kind_)
    : parent(parent_)
    , kind(kind_)
{
}